

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt_signal.cpp
# Opt level: O3

int main(void)

{
  function<void_()> *pfVar1;
  uv_loop_t *puVar2;
  uint uVar3;
  int iVar4;
  Exception *this;
  error_code ec;
  error_code ec_00;
  Signal signal;
  Loop loop;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  Signal local_448;
  Loop local_370;
  
  local_448.super_Handle<uv_signal_s>.handle_.data = &local_448;
  local_448.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_448.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_448.super_Handle<uv_signal_s>.closeHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Handle<uv_signal_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_invoke;
  local_448.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Handle<uv_signal_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_manager;
  local_448.startHandler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_448.startHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_448.startHandler_._M_invoker =
       std::
       _Function_handler<void_(int),_uv::Signal::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Signal.hpp:28:57)>
       ::_M_invoke;
  local_448.startHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_uv::Signal::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Signal.hpp:28:57)>
       ::_M_manager;
  local_370.loop_ptr_ = &local_370.loop_;
  uVar3 = uv_loop_init(&local_370);
  puVar2 = local_370.loop_ptr_;
  if (uVar3 == 0) {
    if ((Loop *)local_370.loop_ptr_ != (Loop *)0x0) {
      ((uv_loop_t *)&(local_370.loop_ptr_)->data)->data = &local_370;
      uVar3 = uv_signal_init(puVar2,&local_448);
      if (uVar3 == 0) {
        local_468._M_unused._M_object = (void *)0x0;
        local_468._8_8_ = 0;
        local_450 = std::
                    _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/interrupt_signal.cpp:13:16)>
                    ::_M_invoke;
        local_458 = std::
                    _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/interrupt_signal.cpp:13:16)>
                    ::_M_manager;
        uv::Signal::start(&local_448,(function<void_(int)> *)&local_468,2);
        if (local_458 != (code *)0x0) {
          (*local_458)(&local_468,&local_468,__destroy_functor);
        }
        uv::Loop::run(&local_370);
        if (local_448.startHandler_.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_448.startHandler_.super__Function_base._M_manager)
                    ((_Any_data *)&local_448.startHandler_,(_Any_data *)&local_448.startHandler_,
                     __destroy_functor);
        }
        if (local_448.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          pfVar1 = &local_448.super_Handle<uv_signal_s>.closeHandler_;
          (*local_448.super_Handle<uv_signal_s>.closeHandler_.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        uv_loop_close(local_370.loop_ptr_);
        return 0;
      }
      if (uv::getCategory()::instance == '\0') {
        main_cold_1();
      }
      this = (Exception *)__cxa_allocate_exception(0x38);
      ec_00._4_4_ = 0;
      ec_00._M_value = uVar3;
      ec_00._M_cat = (error_category *)&uv::getCategory()::instance;
      uv::Exception::Exception(this,ec_00);
      goto LAB_0010258d;
    }
    uVar3 = 0xc;
    if (uv::getCategory()::instance == '\0') {
      iVar4 = __cxa_guard_acquire(&uv::getCategory()::instance);
      uVar3 = 0xc;
      goto LAB_001025b4;
    }
  }
  else if (uv::getCategory()::instance == '\0') {
    iVar4 = __cxa_guard_acquire(&uv::getCategory()::instance);
LAB_001025b4:
    if (iVar4 != 0) {
      __cxa_atexit(std::_V2::error_category::~error_category,&uv::getCategory()::instance,
                   &__dso_handle);
      __cxa_guard_release(&uv::getCategory()::instance);
    }
  }
  this = (Exception *)__cxa_allocate_exception(0x38);
  ec._4_4_ = 0;
  ec._M_value = uVar3;
  ec._M_cat = (error_category *)&uv::getCategory()::instance;
  uv::Exception::Exception(this,ec);
LAB_0010258d:
  __cxa_throw(this,&uv::Exception::typeinfo,uv::Exception::~Exception);
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Signal signal;

	try {
		loop.init();
		signal.init(loop);

		signal.start([](int signum) {
			std::cout << "Ctrl+C中断,信号量值为:" << signum << std::endl;
		}, SIGINT);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}